

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

cl_int __thiscall
CLIntercept::CopyImageHelper
          (CLIntercept *this,cl_context context,cl_command_queue commandQueue,cl_mem srcImage,
          cl_mem dstImage,size_t *srcOrigin,size_t *dstOrigin,size_t *region,
          cl_uint numEventsInWaitList,cl_event *eventWaitList,cl_event *event)

{
  mapped_type pSVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  mapped_type *ppSVar13;
  long lVar14;
  ulong uVar15;
  cl_kernel p_Var16;
  cl_mem_object_type dstType;
  cl_mem_object_type srcType;
  cl_image_format srcFormat;
  cl_mem srcImage_local;
  cl_image_format dstFormat;
  cl_uint uiArg;
  cl_mem dstImage_local;
  cl_command_queue local_80;
  size_t local_work_size [3];
  size_t local_58;
  size_t sStack_50;
  size_t local_48;
  cl_context context_local;
  
  srcImage_local = srcImage;
  dstImage_local = dstImage;
  context_local = context;
  ppSVar13 = std::
             map<_cl_context_*,_CLIntercept::SPrecompiledKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SPrecompiledKernelOverrides_*>_>_>
             ::operator[](&this->m_PrecompiledKernelOverridesMap,&context_local);
  pSVar1 = *ppSVar13;
  srcType = 0x10f0;
  uVar2 = 0xffffffe2;
  if (pSVar1 != (mapped_type)0x0) {
    uVar2 = (*(this->m_Dispatch).clGetMemObjectInfo)(srcImage_local,0x1100,4,&srcType,(size_t *)0x0)
    ;
  }
  dstType = 0x10f0;
  if (uVar2 == 0) {
    uVar2 = (*(this->m_Dispatch).clGetMemObjectInfo)(srcImage_local,0x1100,4,&dstType,(size_t *)0x0)
    ;
  }
  srcFormat.image_channel_order = 0;
  srcFormat.image_channel_data_type = 0;
  if (uVar2 == 0) {
    uVar2 = (*(this->m_Dispatch).clGetImageInfo)(srcImage_local,0x1110,8,&srcFormat,(size_t *)0x0);
  }
  dstFormat.image_channel_order = 0;
  dstFormat.image_channel_data_type = 0;
  if (uVar2 == 0) {
    uVar2 = (*(this->m_Dispatch).clGetImageInfo)(dstImage_local,0x1110,8,&dstFormat,(size_t *)0x0);
  }
  if (uVar2 == 0) {
    if (srcFormat.image_channel_data_type == dstFormat.image_channel_data_type) {
      uVar2 = 0;
      if (srcFormat.image_channel_order != dstFormat.image_channel_order) goto LAB_0018980e;
    }
    else {
LAB_0018980e:
      uVar2 = 0xfffffff7;
    }
    if (srcType != 0x10f2) {
      if (srcType == 0x10f1) {
        if ((srcOrigin[2] != 0) || (region[2] != 1)) {
          uVar2 = 0xffffffe2;
        }
      }
      else {
        uVar2 = 0xffffffc5;
      }
    }
    if (dstType != 0x10f2) {
      if (dstType == 0x10f1) {
        if ((dstOrigin[2] != 0) || (region[2] != 1)) {
          uVar2 = 0xffffffe2;
        }
      }
      else {
        uVar2 = 0xffffffc5;
      }
    }
  }
  if (uVar2 == 0) {
    uVar2 = 0xffffffd9;
    p_Var16 = (cl_kernel)0x0;
    uVar3 = srcFormat.image_channel_data_type - 0x10d0;
    if (uVar3 < 0xf) {
      if ((0x600fU >> (uVar3 & 0x1f) & 1) == 0) {
        if ((0x380U >> (uVar3 & 0x1f) & 1) == 0) {
          if ((0x1c00U >> (uVar3 & 0x1f) & 1) == 0) goto LAB_00189929;
          p_Var16 = (cl_kernel)0x0;
          uVar2 = 0xffffffc5;
          if (srcType != 0x10f1) goto LAB_00189929;
          lVar14 = 0x38;
        }
        else {
          p_Var16 = (cl_kernel)0x0;
          uVar2 = 0xffffffc5;
          if (srcType != 0x10f1) goto LAB_00189929;
          lVar14 = 0x30;
        }
      }
      else {
        p_Var16 = (cl_kernel)0x0;
        uVar2 = 0xffffffc5;
        if (srcType != 0x10f1) goto LAB_00189929;
        lVar14 = 0x28;
      }
      p_Var16 = (cl_kernel)0x0;
      uVar2 = 0xffffffc5;
      if (dstType == 0x10f1) {
        p_Var16 = *(cl_kernel *)((long)&pSVar1->Program + lVar14);
        uVar2 = 0;
      }
    }
  }
  else {
    p_Var16 = (cl_kernel)0x0;
  }
LAB_00189929:
  if (uVar2 == 0) {
    local_80 = commandQueue;
    uVar3 = (*(this->m_Dispatch).clSetKernelArg)(p_Var16,0,8,&srcImage_local);
    uVar4 = (*(this->m_Dispatch).clSetKernelArg)(p_Var16,1,8,&dstImage_local);
    uiArg = (cl_uint)*srcOrigin;
    uVar5 = (*(this->m_Dispatch).clSetKernelArg)(p_Var16,2,4,&uiArg);
    uiArg = (cl_uint)srcOrigin[1];
    uVar6 = (*(this->m_Dispatch).clSetKernelArg)(p_Var16,3,4,&uiArg);
    uiArg = (cl_uint)srcOrigin[2];
    uVar7 = (*(this->m_Dispatch).clSetKernelArg)(p_Var16,4,4,&uiArg);
    uiArg = (cl_uint)*dstOrigin;
    uVar8 = (*(this->m_Dispatch).clSetKernelArg)(p_Var16,5,4,&uiArg);
    uiArg = (cl_uint)dstOrigin[1];
    uVar9 = (*(this->m_Dispatch).clSetKernelArg)(p_Var16,6,4,&uiArg);
    uiArg = (cl_uint)dstOrigin[2];
    uVar10 = (*(this->m_Dispatch).clSetKernelArg)(p_Var16,7,4,&uiArg);
    uiArg = (cl_uint)*region;
    uVar11 = (*(this->m_Dispatch).clSetKernelArg)(p_Var16,8,4,&uiArg);
    uiArg = (cl_uint)region[1];
    uVar12 = (*(this->m_Dispatch).clSetKernelArg)(p_Var16,9,4,&uiArg);
    uiArg = (cl_uint)region[2];
    uVar2 = (*(this->m_Dispatch).clSetKernelArg)(p_Var16,10,4,&uiArg);
    uVar2 = uVar2 | uVar12 | uVar11 | uVar10 | uVar9 | uVar8 | uVar7 | uVar6 | uVar5 | uVar4 | uVar3
    ;
    if (uVar2 == 0) {
      local_58 = *region;
      sStack_50 = region[1];
      local_48 = region[2];
      local_work_size[0]._0_4_ = 0x20;
      local_work_size[0]._4_4_ = 0;
      local_work_size[1]._0_4_ = 1;
      local_work_size[1]._4_4_ = 0;
      local_work_size[2] = 1;
      uVar15 = *region % 0x20;
      if (uVar15 != 0) {
        local_58 = (*region + 0x20) - uVar15;
      }
      uVar2 = (*(this->m_Dispatch).clEnqueueNDRangeKernel)
                        (local_80,p_Var16,3,(size_t *)0x0,&local_58,local_work_size,
                         numEventsInWaitList,eventWaitList,event);
    }
  }
  return uVar2;
}

Assistant:

cl_int CLIntercept::CopyImageHelper(
    cl_context context,
    cl_command_queue commandQueue,
    cl_mem srcImage,
    cl_mem dstImage,
    const size_t* srcOrigin,
    const size_t* dstOrigin,
    const size_t* region,
    cl_uint numEventsInWaitList,
    const cl_event* eventWaitList,
    cl_event* event )
{
    // This function assumes that it is being called from within a critical
    // section, so it does not enter the critical section again.

    cl_int  errorCode = CL_SUCCESS;

    SPrecompiledKernelOverrides*    pOverrides = NULL;

    // Get the overrides for this context.
    if( errorCode == CL_SUCCESS )
    {
        pOverrides = m_PrecompiledKernelOverridesMap[ context ];
        if( pOverrides == NULL )
        {
            errorCode = CL_INVALID_VALUE;
        }
    }

    // Figure out the type of the source image.
    cl_mem_object_type  srcType = CL_MEM_OBJECT_BUFFER;
    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetMemObjectInfo(
            srcImage,
            CL_MEM_TYPE,
            sizeof( srcType ),
            &srcType,
            NULL );
    }

    // Figure out the type of the destination image.
    cl_mem_object_type  dstType = CL_MEM_OBJECT_BUFFER;
    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetMemObjectInfo(
            srcImage,
            CL_MEM_TYPE,
            sizeof( dstType ),
            &dstType,
            NULL );
    }

    // Figure out the format of the source image.
    cl_image_format srcFormat = { 0 };
    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetImageInfo(
            srcImage,
            CL_IMAGE_FORMAT,
            sizeof( srcFormat ),
            &srcFormat,
            NULL );
    }

    // Figure out the format of the destination image.
    cl_image_format dstFormat = { 0 };
    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetImageInfo(
            dstImage,
            CL_IMAGE_FORMAT,
            sizeof( dstFormat ),
            &dstFormat,
            NULL );
    }

    // Image formats must match.
    if( errorCode == CL_SUCCESS )
    {
        if( ( srcFormat.image_channel_data_type != dstFormat.image_channel_data_type ) ||
            ( srcFormat.image_channel_order != dstFormat.image_channel_order ) )
        {
            errorCode = CL_IMAGE_FORMAT_MISMATCH;
        }
        switch( srcType )
        {
        case CL_MEM_OBJECT_IMAGE2D:
            if( ( srcOrigin[2] != 0 ) ||
                ( region[2] != 1 ) )
            {
                errorCode = CL_INVALID_VALUE;
            }
            break;
        case CL_MEM_OBJECT_IMAGE3D:
            break;
        default:
            errorCode = CL_INVALID_OPERATION;
            break;
        }
        switch( dstType )
        {
        case CL_MEM_OBJECT_IMAGE2D:
            if( ( dstOrigin[2] != 0 ) ||
                ( region[2] != 1 ) )
            {
                errorCode = CL_INVALID_VALUE;
            }
            break;
        case CL_MEM_OBJECT_IMAGE3D:
            break;
        default:
            errorCode = CL_INVALID_OPERATION;
            break;
        }
    }

    cl_kernel   kernel = NULL;
    if( errorCode == CL_SUCCESS )
    {
        switch( srcFormat.image_channel_data_type )
        {
        case CL_UNORM_INT8:
        case CL_UNORM_INT16:
        case CL_SNORM_INT8:
        case CL_SNORM_INT16:
        case CL_HALF_FLOAT:
        case CL_FLOAT:
            // "Float" Images
            switch( srcType )
            {
            case CL_MEM_OBJECT_IMAGE2D:
                switch( dstType )
                {
                case CL_MEM_OBJECT_IMAGE2D:
                    // 2D to 2D
                    kernel = pOverrides->Kernel_CopyImage2Dto2DFloat;
                    break;
                default:
                    CLI_ASSERT( 0 );
                    errorCode = CL_INVALID_OPERATION;
                    break;
                }
                break;
            default:
                CLI_ASSERT( 0 );
                errorCode = CL_INVALID_OPERATION;
                break;
            }
            break;

        case CL_SIGNED_INT8:
        case CL_SIGNED_INT16:
        case CL_SIGNED_INT32:
            // "Int" Images
            switch( srcType )
            {
            case CL_MEM_OBJECT_IMAGE2D:
                switch( dstType )
                {
                case CL_MEM_OBJECT_IMAGE2D:
                    // 2D to 2D
                    kernel = pOverrides->Kernel_CopyImage2Dto2DInt;
                    break;
                default:
                    CLI_ASSERT( 0 );
                    errorCode = CL_INVALID_OPERATION;
                    break;
                }
                break;
            default:
                CLI_ASSERT( 0 );
                errorCode = CL_INVALID_OPERATION;
                break;
            }
            break;

        case CL_UNSIGNED_INT8:
        case CL_UNSIGNED_INT16:
        case CL_UNSIGNED_INT32:
            // "UInt" Images
            switch( srcType )
            {
            case CL_MEM_OBJECT_IMAGE2D:
                switch( dstType )
                {
                case CL_MEM_OBJECT_IMAGE2D:
                    // 2D to 2D
                    kernel = pOverrides->Kernel_CopyImage2Dto2DUInt;
                    break;
                default:
                    CLI_ASSERT( 0 );
                    errorCode = CL_INVALID_OPERATION;
                    break;
                }
                break;
            default:
                CLI_ASSERT( 0 );
                errorCode = CL_INVALID_OPERATION;
                break;
            }
            break;

        default:
            CLI_ASSERT( 0 );
            errorCode = CL_INVALID_IMAGE_FORMAT_DESCRIPTOR;
            break;
        }
    }

    if( errorCode == CL_SUCCESS )
    {
        errorCode |= dispatch().clSetKernelArg(
            kernel,
            0,
            sizeof( srcImage ),
            &srcImage );
        errorCode |= dispatch().clSetKernelArg(
            kernel,
            1,
            sizeof( dstImage ),
            &dstImage );

        cl_uint uiArg = (cl_uint)( srcOrigin[0] );
        errorCode |= dispatch().clSetKernelArg(
            kernel,
            2,
            sizeof( uiArg ),
            &uiArg );
        uiArg = (cl_uint)( srcOrigin[1] );
        errorCode |= dispatch().clSetKernelArg(
            kernel,
            3,
            sizeof( uiArg ),
            &uiArg );
        uiArg = (cl_uint)( srcOrigin[2] );
        errorCode |= dispatch().clSetKernelArg(
            kernel,
            4,
            sizeof( uiArg ),
            &uiArg );

        uiArg = (cl_uint)( dstOrigin[0] );
        errorCode |= dispatch().clSetKernelArg(
            kernel,
            5,
            sizeof( uiArg ),
            &uiArg );
        uiArg = (cl_uint)( dstOrigin[1] );
        errorCode |= dispatch().clSetKernelArg(
            kernel,
            6,
            sizeof( uiArg ),
            &uiArg );
        uiArg = (cl_uint)( dstOrigin[2] );
        errorCode |= dispatch().clSetKernelArg(
            kernel,
            7,
            sizeof( uiArg ),
            &uiArg );

        uiArg = (cl_uint)( region[0] );
        errorCode |= dispatch().clSetKernelArg(
            kernel,
            8,
            sizeof( uiArg ),
            &uiArg );
        uiArg = (cl_uint)( region[1] );
        errorCode |= dispatch().clSetKernelArg(
            kernel,
            9,
            sizeof( uiArg ),
            &uiArg );
        uiArg = (cl_uint)( region[2] );
        errorCode |= dispatch().clSetKernelArg(
            kernel,
            10,
            sizeof( uiArg ),
            &uiArg );

        if( errorCode == CL_SUCCESS )
        {
            size_t  global_work_size[3] =
            {
                region[0],
                region[1],
                region[2]
            };
            size_t  local_work_size[3] =
            {
                32,
                1,
                1
            };

            // Make sure global_work_size is an even multiple of local_work_size
            if( ( global_work_size[0] % local_work_size[0] ) != 0 )
            {
                global_work_size[0] +=
                    local_work_size[0] -
                    ( global_work_size[0] % local_work_size[0] );
            }
            CLI_ASSERT( local_work_size[1] == 1 );
            CLI_ASSERT( local_work_size[2] == 1 );

            // Execute kernel
            errorCode = dispatch().clEnqueueNDRangeKernel(
                commandQueue,
                kernel,
                3,
                NULL,
                global_work_size,
                local_work_size,
                numEventsInWaitList,
                eventWaitList,
                event );
        }
    }

    return errorCode;
}